

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

int __thiscall cmCPackGenerator::CleanTemporaryDirectory(cmCPackGenerator *this)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  string local_3a0 [32];
  undefined1 local_380 [8];
  ostringstream cmCPackLog_msg_1;
  string local_208 [32];
  undefined1 local_1e8 [8];
  ostringstream cmCPackLog_msg;
  allocator<char> local_6d [20];
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  string tempInstallDirectory;
  cmCPackGenerator *this_local;
  
  tempInstallDirectory.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CPACK_TEMPORARY_INSTALL_DIRECTORY",&local_59);
  pcVar3 = GetOption(this,&local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,pcVar3,local_6d);
  std::allocator<char>::~allocator(local_6d);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  bVar2 = cmsys::SystemTools::FileExists((string *)local_38);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
    poVar4 = std::operator<<((ostream *)local_1e8,"- Clean temporary : ");
    poVar4 = std::operator<<(poVar4,(string *)local_38);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->Logger;
    std::__cxx11::ostringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x4ef,pcVar3);
    std::__cxx11::string::~string(local_208);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
    bVar2 = cmSystemTools::RepeatedRemoveDirectory((string *)local_38);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_380);
      poVar4 = std::operator<<((ostream *)local_380,"Problem removing temporary directory: ");
      poVar4 = std::operator<<(poVar4,(string *)local_38);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x4f3,pcVar3);
      std::__cxx11::string::~string(local_3a0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_380);
      this_local._4_4_ = 0;
      goto LAB_00151a83;
    }
  }
  this_local._4_4_ = 1;
LAB_00151a83:
  std::__cxx11::string::~string((string *)local_38);
  return this_local._4_4_;
}

Assistant:

int cmCPackGenerator::CleanTemporaryDirectory()
{
  std::string tempInstallDirectory =
    this->GetOption("CPACK_TEMPORARY_INSTALL_DIRECTORY");
  if (cmsys::SystemTools::FileExists(tempInstallDirectory)) {
    cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                  "- Clean temporary : " << tempInstallDirectory << std::endl);
    if (!cmSystemTools::RepeatedRemoveDirectory(tempInstallDirectory)) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Problem removing temporary directory: "
                      << tempInstallDirectory << std::endl);
      return 0;
    }
  }
  return 1;
}